

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecCo.c
# Opt level: O0

void Gia_PolynCoreCollect_rec(Gia_Man_t *pGia,int iObj,Vec_Int_t *vNodes,Vec_Bit_t *vVisited)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  Vec_Bit_t *vVisited_local;
  Vec_Int_t *vNodes_local;
  int iObj_local;
  Gia_Man_t *pGia_local;
  
  iVar1 = Vec_BitEntry(vVisited,iObj);
  if (iVar1 == 0) {
    Vec_BitSetEntry(vVisited,iObj,1);
    pGVar2 = Gia_ManObj(pGia,iObj);
    iVar1 = Gia_ObjFaninId0p(pGia,pGVar2);
    Gia_PolynCoreCollect_rec(pGia,iVar1,vNodes,vVisited);
    pGVar2 = Gia_ManObj(pGia,iObj);
    iVar1 = Gia_ObjFaninId1p(pGia,pGVar2);
    Gia_PolynCoreCollect_rec(pGia,iVar1,vNodes,vVisited);
    Vec_IntPush(vNodes,iObj);
  }
  return;
}

Assistant:

void Gia_PolynCoreCollect_rec( Gia_Man_t * pGia, int iObj, Vec_Int_t * vNodes, Vec_Bit_t * vVisited )
{
    if ( Vec_BitEntry(vVisited, iObj) )
        return;
    Vec_BitSetEntry( vVisited, iObj, 1 );
    Gia_PolynCoreCollect_rec( pGia, Gia_ObjFaninId0p(pGia, Gia_ManObj(pGia, iObj)), vNodes, vVisited );
    Gia_PolynCoreCollect_rec( pGia, Gia_ObjFaninId1p(pGia, Gia_ManObj(pGia, iObj)), vNodes, vVisited );
    Vec_IntPush( vNodes, iObj );
}